

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<basisu::vector<basisu::gpu_image>_>::~vector
          (vector<basisu::vector<basisu::gpu_image>_> *this)

{
  if (this->m_p != (vector<basisu::gpu_image> *)0x0) {
    destruct_array<basisu::vector<basisu::gpu_image>>(this->m_p,(ulong)this->m_size);
    free(this->m_p);
    return;
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }